

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vecWec.h
# Opt level: O0

int Vec_WecCountNonTrivial(Vec_Wec_t *p,int *pnUsed)

{
  int iVar1;
  Vec_Int_t *p_00;
  undefined4 local_28;
  undefined4 local_24;
  int nClasses;
  int i;
  Vec_Int_t *vClass;
  int *pnUsed_local;
  Vec_Wec_t *p_local;
  
  local_28 = 0;
  *pnUsed = 0;
  for (local_24 = 0; iVar1 = Vec_WecSize(p), local_24 < iVar1; local_24 = local_24 + 1) {
    p_00 = Vec_WecEntry(p,local_24);
    iVar1 = Vec_IntSize(p_00);
    if (1 < iVar1) {
      local_28 = local_28 + 1;
      iVar1 = Vec_IntSize(p_00);
      *pnUsed = iVar1 + *pnUsed;
    }
  }
  return local_28;
}

Assistant:

static inline int Vec_WecCountNonTrivial( Vec_Wec_t * p, int * pnUsed )
{
    Vec_Int_t * vClass;
    int i, nClasses = 0;
    *pnUsed = 0;
    Vec_WecForEachLevel( p, vClass, i )
    {
        if ( Vec_IntSize(vClass) < 2 )
            continue;
        nClasses++;
        (*pnUsed) += Vec_IntSize(vClass);
    }
    return nClasses;
}